

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>_>,_char16_t>
                    *b)

{
  ArrayOptions *pAVar1;
  QString *pQVar2;
  long lVar3;
  Data *pDVar4;
  long lVar5;
  long lVar6;
  char16_t *__src;
  long lVar7;
  long lVar8;
  QChar *pQVar9;
  QChar *__dest;
  
  pDVar4 = (a->d).d;
  lVar5 = (a->d).size;
  lVar8 = (((b->a).b.a.b)->d).size + (b->a).a.a.m_size + lVar5 + 4;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar5);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) goto LAB_00520d52;
    if (0 < lVar8) {
      lVar5 = (a->d).size;
      goto LAB_00520da7;
    }
  }
  else {
LAB_00520d52:
    lVar6 = (pDVar4->super_QArrayData).alloc;
    lVar5 = (a->d).size;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar6 - lVar5) - lVar7 < lVar8) {
      lVar3 = lVar6 * 2;
      if (lVar6 * 2 < lVar8) {
        lVar3 = lVar8;
      }
      lVar8 = lVar3;
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar6 - lVar7 <= lVar8)) {
LAB_00520da7:
        if (lVar8 < lVar5) {
          lVar8 = lVar5;
        }
        QString::reallocData((longlong)a,(AllocationOption)lVar8);
        pDVar4 = (a->d).d;
        if (pDVar4 == (Data *)0x0) goto LAB_00520dd7;
        lVar6 = (pDVar4->super_QArrayData).alloc;
      }
      if (lVar6 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_00520de8;
  }
LAB_00520dd7:
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_00520de8:
  pQVar9 = (QChar *)((a->d).ptr + (a->d).size);
  lVar5 = (b->a).a.a.m_size;
  QAbstractConcatenable::appendLatin1To((b->a).a.a,pQVar9);
  pQVar9 = pQVar9 + lVar5;
  __dest = pQVar9 + 2;
  pQVar9->ucs = (b->a).a.b;
  pQVar9[1].ucs = (b->a).b.a.a;
  pQVar2 = (b->a).b.a.b;
  lVar5 = (pQVar2->d).size;
  if (lVar5 != 0) {
    __src = (pQVar2->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,__src,lVar5 * 2);
  }
  __dest[lVar5].ucs = (b->a).b.b;
  (__dest + lVar5)[1].ucs = b->b;
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}